

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateOneNamespace
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *prefix,xmlNsPtr ns,
              xmlChar *value)

{
  xmlDtdPtr pxVar1;
  xmlHashTablePtr pxVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlAttributePtr pxVar6;
  void *pvVar7;
  char *pcVar8;
  xmlEnumerationPtr pxVar9;
  xmlChar fn [50];
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  uint local_70;
  xmlChar local_68 [56];
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  if (ns == (xmlNsPtr)0x0 || elem->name == (xmlChar *)0x0) {
    return 0;
  }
  if (ns->href == (xmlChar *)0x0) {
    return 0;
  }
  if (prefix == (xmlChar *)0x0) {
    pxVar6 = (xmlAttributePtr)0x0;
  }
  else {
    pxVar5 = xmlBuildQName(elem->name,prefix,local_68,0x32);
    if (pxVar5 == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt,"Validating namespace");
      pxVar6 = (xmlAttributePtr)0x0;
    }
    else {
      pxVar1 = doc->intSubset;
      if (ns->prefix == (xmlChar *)0x0) {
        pxVar6 = xmlGetDtdAttrDesc(pxVar1,pxVar5,"xmlns");
        if (pxVar6 == (xmlAttributePtr)0x0) {
          if (doc->extSubset == (xmlDtdPtr)0x0) goto LAB_001929d0;
          pxVar6 = xmlGetDtdAttrDesc(doc->extSubset,pxVar5,"xmlns");
        }
      }
      else {
        if ((pxVar1 == (xmlDtdPtr)0x0) ||
           ((xmlHashTablePtr)pxVar1->attributes == (xmlHashTablePtr)0x0)) {
          pxVar6 = (xmlAttributePtr)0x0;
        }
        else {
          pxVar6 = (xmlAttributePtr)
                   xmlHashLookup3((xmlHashTablePtr)pxVar1->attributes,ns->prefix,"xmlns",pxVar5);
        }
        if (pxVar6 == (xmlAttributePtr)0x0) {
          if ((doc->extSubset == (_xmlDtd *)0x0) ||
             (pxVar2 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar2 == (xmlHashTablePtr)0x0))
          {
LAB_001929d0:
            pxVar6 = (xmlAttributePtr)0x0;
          }
          else {
            pxVar6 = (xmlAttributePtr)xmlHashLookup3(pxVar2,ns->prefix,"xmlns",pxVar5);
          }
        }
      }
      if ((pxVar5 != local_68) && (pxVar5 != elem->name)) {
        (*xmlFree)(pxVar5);
      }
    }
    if (pxVar5 == (xmlChar *)0x0) {
      return 0;
    }
  }
  if (pxVar6 != (xmlAttributePtr)0x0) goto LAB_001929fc;
  pxVar1 = doc->intSubset;
  if (ns->prefix == (xmlChar *)0x0) {
    pxVar6 = xmlGetDtdAttrDesc(pxVar1,elem->name,"xmlns");
    if (pxVar6 != (xmlAttributePtr)0x0) goto LAB_001929fc;
    if (doc->extSubset != (xmlDtdPtr)0x0) {
      pxVar6 = xmlGetDtdAttrDesc(doc->extSubset,elem->name,"xmlns");
      goto LAB_001929fc;
    }
  }
  else {
    if ((pxVar1 == (xmlDtdPtr)0x0) || ((xmlHashTablePtr)pxVar1->attributes == (xmlHashTablePtr)0x0))
    {
      pxVar6 = (xmlAttributePtr)0x0;
    }
    else {
      pxVar6 = (xmlAttributePtr)
               xmlHashLookup3((xmlHashTablePtr)pxVar1->attributes,ns->prefix,"xmlns",elem->name);
    }
    if (pxVar6 != (xmlAttributePtr)0x0) goto LAB_001929fc;
    if ((doc->extSubset != (_xmlDtd *)0x0) &&
       (pxVar2 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar2 != (xmlHashTablePtr)0x0)) {
      pxVar6 = (xmlAttributePtr)xmlHashLookup3(pxVar2,ns->prefix,"xmlns",elem->name);
      goto LAB_001929fc;
    }
  }
  pxVar6 = (xmlAttributePtr)0x0;
LAB_001929fc:
  if (pxVar6 == (xmlAttributePtr)0x0) {
    if (ns->prefix != (xmlChar *)0x0) {
      xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,
                      "No declaration for attribute xmlns:%s of element %s\n",ns->prefix,elem->name,
                      (xmlChar *)0x0);
      return 0;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,
                    "No declaration for attribute xmlns of element %s\n",elem->name,(xmlChar *)0x0,
                    (xmlChar *)0x0);
    return 0;
  }
  iVar3 = xmlValidateAttributeValueInternal(doc,pxVar6->atype,value);
  local_70 = 1;
  if (iVar3 == 0) {
    if (ns->prefix == (xmlChar *)0x0) {
      local_70 = 0;
      xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_DEFAULT,
                      "Syntax of value for attribute xmlns of %s is not valid\n",elem->name,
                      (xmlChar *)0x0,(xmlChar *)0x0);
    }
    else {
      xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_DEFAULT,
                      "Syntax of value for attribute xmlns:%s of %s is not valid\n",ns->prefix,
                      elem->name,(xmlChar *)0x0);
      local_70 = 0;
    }
  }
  if ((pxVar6->def == XML_ATTRIBUTE_FIXED) &&
     (iVar3 = xmlStrEqual(value,pxVar6->defaultValue), iVar3 == 0)) {
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar11 = (xmlChar *)0x0;
      pcVar8 = "Value for attribute xmlns of %s is different from default \"%s\"\n";
      pxVar5 = elem->name;
      pxVar10 = pxVar6->defaultValue;
    }
    else {
      pcVar8 = "Value for attribute xmlns:%s of %s is different from default \"%s\"\n";
      pxVar5 = ns->prefix;
      pxVar10 = elem->name;
      pxVar11 = pxVar6->defaultValue;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,pcVar8,pxVar5,pxVar10,pxVar11);
    local_70 = 0;
  }
  if (pxVar6->atype == XML_ATTRIBUTE_NOTATION) {
    pxVar9 = pxVar6->tree;
    if ((((doc->intSubset == (_xmlDtd *)0x0) ||
         (pxVar2 = (xmlHashTablePtr)doc->intSubset->notations, pxVar2 == (xmlHashTablePtr)0x0)) ||
        (pvVar7 = xmlHashLookup(pxVar2,value), pvVar7 == (void *)0x0)) &&
       (((doc->extSubset == (_xmlDtd *)0x0 ||
         (pxVar2 = (xmlHashTablePtr)doc->extSubset->notations, pxVar2 == (xmlHashTablePtr)0x0)) ||
        (pvVar7 = xmlHashLookup(pxVar2,value), pvVar7 == (void *)0x0)))) {
      if (ns->prefix == (xmlChar *)0x0) {
        pxVar10 = (xmlChar *)0x0;
        pcVar8 = "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n";
        pxVar5 = elem->name;
      }
      else {
        pcVar8 = "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n";
        pxVar5 = ns->prefix;
        pxVar10 = elem->name;
      }
      xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,pcVar8,value,pxVar5,pxVar10);
      local_70 = 0;
    }
    for (; pxVar9 != (xmlEnumerationPtr)0x0; pxVar9 = pxVar9->next) {
      iVar3 = xmlStrEqual(pxVar9->name,value);
      if (iVar3 != 0) goto LAB_00192d48;
    }
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar10 = (xmlChar *)0x0;
      pcVar8 = "Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n";
      pxVar5 = elem->name;
    }
    else {
      pcVar8 = "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n";
      pxVar5 = ns->prefix;
      pxVar10 = elem->name;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_NOTATION_VALUE,pcVar8,value,pxVar5,pxVar10);
    local_70 = 0;
  }
LAB_00192d48:
  if (pxVar6->atype == XML_ATTRIBUTE_ENUMERATION) {
    pxVar9 = (xmlEnumerationPtr)&pxVar6->tree;
    do {
      pxVar9 = pxVar9->next;
      if (pxVar9 == (xmlEnumerationPtr)0x0) {
        if (ns->prefix == (xmlChar *)0x0) {
          pxVar10 = (xmlChar *)0x0;
          pcVar8 = "Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n";
          pxVar5 = elem->name;
        }
        else {
          pcVar8 = "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n";
          pxVar5 = ns->prefix;
          pxVar10 = elem->name;
        }
        xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,pcVar8,value,pxVar5,pxVar10);
        local_70 = 0;
        break;
      }
      iVar3 = xmlStrEqual(pxVar9->name,value);
    } while (iVar3 == 0);
  }
  if ((pxVar6->def == XML_ATTRIBUTE_FIXED) &&
     (iVar3 = xmlStrEqual(pxVar6->defaultValue,value), iVar3 == 0)) {
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar11 = (xmlChar *)0x0;
      pcVar8 = "Value for attribute xmlns of %s must be \"%s\"\n";
      pxVar5 = elem->name;
      pxVar10 = pxVar6->defaultValue;
    }
    else {
      pcVar8 = "Value for attribute xmlns:%s of %s must be \"%s\"\n";
      pxVar5 = ns->prefix;
      pxVar10 = elem->name;
      pxVar11 = pxVar6->defaultValue;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_NAMESPACE,pcVar8,pxVar5,pxVar10,pxVar11);
    local_70 = 0;
  }
  pxVar5 = "xmlns";
  if (ns->prefix != (xmlChar *)0x0) {
    pxVar5 = ns->prefix;
  }
  uVar4 = xmlValidateAttributeValue2(ctxt,doc,pxVar5,pxVar6->atype,value);
  return uVar4 & local_70;
}

Assistant:

int
xmlValidateOneNamespace(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
xmlNodePtr elem, const xmlChar *prefix, xmlNsPtr ns, const xmlChar *value) {
    /* xmlElementPtr elemDecl; */
    xmlAttributePtr attrDecl =  NULL;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((ns == NULL) || (ns->href == NULL)) return(0);

    if (prefix != NULL) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, prefix, fn, 50);
	if (fullname == NULL) {
	    xmlVErrMemory(ctxt, "Validating namespace");
	    return(0);
	}
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
					  ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, fullname,
		                         BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, fullname,
			                 BAD_CAST "xmlns");
	}
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
					      ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset,
		                         elem->name, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset,
					     elem->name, BAD_CAST "xmlns");
	}
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns:%s of element %s\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns of element %s\n",
		   elem->name, NULL, NULL);
	}
	return(0);
    }

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns:%s of %s is not valid\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns of %s is not valid\n",
		   elem->name, NULL, NULL);
	}
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns:%s of %s is different from default \"%s\"\n",
		       ns->prefix, elem->name, attrDecl->defaultValue);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns of %s is different from default \"%s\"\n",
		       elem->name, attrDecl->defaultValue, NULL);
	    }
	    ret = 0;
	}
    }

    /*
     * Casting ns to xmlAttrPtr is wrong. We'd need separate functions
     * xmlAddID and xmlAddRef for namespace declarations, but it makes
     * no practical sense to use ID types anyway.
     */
#if 0
    /* Validity Constraint: ID uniqueness */
    if (attrDecl->atype == XML_ATTRIBUTE_ID) {
        if (xmlAddID(ctxt, doc, value, (xmlAttrPtr) ns) == NULL)
	    ret = 0;
    }

    if ((attrDecl->atype == XML_ATTRIBUTE_IDREF) ||
	(attrDecl->atype == XML_ATTRIBUTE_IDREFS)) {
        if (xmlAddRef(ctxt, doc, value, (xmlAttrPtr) ns) == NULL)
	    ret = 0;
    }
#endif

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns:%s of %s must be \"%s\"\n",
		   ns->prefix, elem->name, attrDecl->defaultValue);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns of %s must be \"%s\"\n",
		   elem->name, attrDecl->defaultValue, NULL);
	}
        ret = 0;
    }

    /* Extra check for the attribute value */
    if (ns->prefix != NULL) {
	ret &= xmlValidateAttributeValue2(ctxt, doc, ns->prefix,
					  attrDecl->atype, value);
    } else {
	ret &= xmlValidateAttributeValue2(ctxt, doc, BAD_CAST "xmlns",
					  attrDecl->atype, value);
    }

    return(ret);
}